

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combination.c
# Opt level: O0

int generateCombinatorialStabilExhaust
              (Aig_Man_t *pAigNew,Aig_Man_t *pAigOld,Vec_Ptr_t *vDisj_nCk_,int combN,int combK)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  Aig_Obj_t *pAVar3;
  int local_50;
  int local_4c;
  int j_KNUTH;
  int i_KNUTH;
  Vec_Int_t *vC_KNUTH;
  int totalCombination_KNUTH;
  int targetPoIndex;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObjMonoCand;
  int combK_local;
  int combN_local;
  Vec_Ptr_t *vDisj_nCk__local;
  Aig_Man_t *pAigOld_local;
  Aig_Man_t *pAigNew_local;
  
  vC_KNUTH._0_4_ = 0;
  p = Vec_IntAlloc(combK + 3);
  for (local_4c = -1; local_4c < combK; local_4c = local_4c + 1) {
    Vec_IntPush(p,local_4c);
  }
  Vec_IntPush(p,combN);
  Vec_IntPush(p,0);
  while( true ) {
    vC_KNUTH._0_4_ = (int)vC_KNUTH + 1;
    pAVar3 = Aig_ManConst1(pAigNew);
    pObj = Aig_Not(pAVar3);
    for (local_4c = combK; 0 < local_4c; local_4c = local_4c + -1) {
      iVar1 = Vec_IntEntry(p,local_4c);
      pAVar3 = Aig_ManLo(pAigOld,iVar1);
      pObj = Aig_Or(pAigNew,(Aig_Obj_t *)(pAVar3->field_5).pData,pObj);
    }
    Vec_PtrPush(vDisj_nCk_,pObj);
    local_50 = 1;
    while( true ) {
      iVar1 = Vec_IntEntry(p,local_50);
      iVar2 = Vec_IntEntry(p,local_50 + 1);
      if (iVar1 + 1 != iVar2) break;
      Vec_IntWriteEntry(p,local_50,local_50 + -1);
      local_50 = local_50 + 1;
    }
    if (combK < local_50) break;
    iVar1 = Vec_IntEntry(p,local_50);
    Vec_IntWriteEntry(p,local_50,iVar1 + 1);
  }
  Vec_IntFree(p);
  return (int)vC_KNUTH;
}

Assistant:

int generateCombinatorialStabilExhaust( Aig_Man_t *pAigNew, Aig_Man_t *pAigOld, 
				Vec_Ptr_t *vDisj_nCk_,
				int combN, int combK )
{
	Aig_Obj_t *pObjMonoCand, *pObj;
	int targetPoIndex;

	//Knuth's Data Strcuture
	int totalCombination_KNUTH = 0;
	Vec_Int_t *vC_KNUTH;
	int i_KNUTH, j_KNUTH;

	//Knuth's Data Structure Initialization
	vC_KNUTH = Vec_IntAlloc(combK+3);
	for(i_KNUTH=-1; i_KNUTH<combK; i_KNUTH++)
		Vec_IntPush( vC_KNUTH, i_KNUTH );
	Vec_IntPush( vC_KNUTH, combN );
	Vec_IntPush( vC_KNUTH, 0 );

	while(1)
	{
		totalCombination_KNUTH++;
		pObjMonoCand = Aig_Not(Aig_ManConst1(pAigNew));
		for( i_KNUTH=combK; i_KNUTH>0; i_KNUTH--)
		{
			//targetPoIndex = Vec_IntEntry( vCandidateMonotoneSignals_, Vec_IntEntry(vC_KNUTH, i_KNUTH));
			targetPoIndex = Vec_IntEntry(vC_KNUTH, i_KNUTH);
			pObj = (Aig_Obj_t *)(Aig_ManLo( pAigOld, targetPoIndex )->pData);
			pObjMonoCand = Aig_Or( pAigNew, pObj, pObjMonoCand );
		}
		Vec_PtrPush(vDisj_nCk_, pObjMonoCand );

		j_KNUTH = 1;
		while( Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 == Vec_IntEntry( vC_KNUTH, j_KNUTH+1 ) )
		{
			Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, j_KNUTH-1 );
			j_KNUTH = j_KNUTH + 1;
		}
		if( j_KNUTH > combK ) break;
		Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 );
	}

	Vec_IntFree(vC_KNUTH);

	return totalCombination_KNUTH;
}